

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O1

int rtr_mgr_add_roa_support(rtr_mgr_config *config,pfx_update_fp pfx_update_fp)

{
  long lVar1;
  pfx_table *pfx_table;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = -1;
  if (config != (rtr_mgr_config *)0x0) {
    pfx_table = (pfx_table *)lrtr_malloc(0x50);
    if (pfx_table != (pfx_table *)0x0) {
      pfx_table_init(pfx_table,pfx_update_fp);
      config->pfx_table = pfx_table;
      iVar2 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_add_roa_support(struct rtr_mgr_config *config, const pfx_update_fp pfx_update_fp)
{
	if (config == NULL) {
		return RTR_ERROR;
	}

	/* Init prefix table that we need to pass to the sockets */
	struct pfx_table *pfxt = lrtr_malloc(sizeof(*pfxt));
	if (!pfxt) {
		return RTR_ERROR;
	}

	pfx_table_init(pfxt, pfx_update_fp);
	config->pfx_table = pfxt;

	return RTR_SUCCESS;
}